

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2PFileSender.cpp
# Opt level: O2

bool __thiscall
P2PFileSender::Initialize(P2PFileSender *this,string *fileSendPath,string *fileSendName)

{
  ostringstream *this_00;
  OutputWorker *this_01;
  SDKJsonResult result;
  string local_1f0 [32];
  undefined1 local_1d0 [40];
  LogStringBuffer local_1a8;
  
  std::__cxx11::string::_M_assign((string *)&this->FileSendPath);
  std::__cxx11::string::_M_assign((string *)&this->FileSendName);
  (this->super_SDKSocket).Config.MaximumClients = 10;
  (this->super_SDKSocket).Config.Flags = 2;
  tonk::SDKSocket::Create((SDKJsonResult *)local_1d0,&this->super_SDKSocket);
  if (local_1d0._0_4_ != Tonk_Success) {
    std::__cxx11::string::string(local_1f0,(string *)(local_1d0 + 8));
    if ((int)Logger.ChannelMinLevel < 5) {
      this_00 = &local_1a8.LogStream;
      local_1a8.ChannelName = Logger.ChannelName;
      local_1a8.LogLevel = Error;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
      std::operator<<((ostream *)this_00,(string *)&Logger.Prefix);
      std::operator<<((ostream *)this_00,"Unable to create socket: ");
      std::operator<<((ostream *)this_00,local_1f0);
      this_01 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(this_01,&local_1a8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
    }
    std::__cxx11::string::~string(local_1f0);
  }
  std::__cxx11::string::~string((string *)(local_1d0 + 8));
  return local_1d0._0_4_ == Tonk_Success;
}

Assistant:

bool P2PFileSender::Initialize(
    const std::string& fileSendPath,
    const std::string& fileSendName)
{
    FileSendPath = fileSendPath;
    FileSendName = fileSendName;

    // Set configuration
    //Config.UDPListenPort = kFileSenderServerPort;
    Config.MaximumClients = 10;
    Config.Flags = TONK_FLAGS_ENABLE_UPNP;
    //Config.EnableFEC = 0;
    //Config.InterfaceAddress = "127.0.0.1";
    //Config.BandwidthLimitBPS = 1000 * 1000 * 1000;

    tonk::SDKJsonResult result = Create();
    if (!result) {
        Logger.Error("Unable to create socket: ", result.ToString());
        return false;
    }

    return true;
}